

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::Statement::visit<slang::ast::UnrollVisitor&>(Statement *this,UnrollVisitor *visitor)

{
  size_type sVar1;
  pointer ppEVar2;
  logic_error *this_00;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  long lVar6;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    switch((((ForLoopStatement *)this)->super_Statement).kind) {
    case Invalid:
    case Empty:
    case VariableDeclaration:
    case Return:
    case Continue:
    case Break:
    case Disable:
    case DisableFork:
    case WaitFork:
    case EventTrigger:
    case ProceduralAssign:
    case ProceduralDeassign:
    case RandSequence:
      return;
    case List:
      sVar1 = (((ForLoopStatement *)this)->initializers).size_;
      if (sVar1 == 0) {
        return;
      }
      ppEVar2 = (((ForLoopStatement *)this)->initializers).data_;
      lVar6 = 0;
      do {
        visit<slang::ast::UnrollVisitor&>(*(Statement **)((long)ppEVar2 + lVar6),visitor);
        lVar6 = lVar6 + 8;
      } while (sVar1 << 3 != lVar6);
      return;
    case Block:
    case ForeverLoop:
      this = (Statement *)(((ForLoopStatement *)this)->initializers).data_;
      break;
    case ExpressionStatement:
      UnrollVisitor::handle(visitor,(ExpressionStatement *)this);
      return;
    case Conditional:
      UnrollVisitor::handle(visitor,(ConditionalStatement *)this);
      return;
    case Case:
      CaseStatement::visitStmts<slang::ast::UnrollVisitor&>((CaseStatement *)this,visitor);
      return;
    case PatternCase:
      PatternCaseStatement::visitStmts<slang::ast::UnrollVisitor&>
                ((PatternCaseStatement *)this,visitor);
      return;
    case ForLoop:
      UnrollVisitor::handle(visitor,(ForLoopStatement *)this);
      return;
    case RepeatLoop:
    case WhileLoop:
    case DoWhileLoop:
    case Timed:
    case Wait:
      this = (Statement *)(((ForLoopStatement *)this)->initializers).size_;
      break;
    case ForeachLoop:
      this = (Statement *)(((ForLoopStatement *)this)->loopVars).size_;
      break;
    case ImmediateAssertion:
      ImmediateAssertionStatement::visitStmts<slang::ast::UnrollVisitor&>
                ((ImmediateAssertionStatement *)this,visitor);
      return;
    case ConcurrentAssertion:
      ConcurrentAssertionStatement::visitStmts<slang::ast::UnrollVisitor&>
                ((ConcurrentAssertionStatement *)this,visitor);
      return;
    case WaitOrder:
      WaitOrderStatement::visitStmts<slang::ast::UnrollVisitor&>((WaitOrderStatement *)this,visitor)
      ;
      return;
    case RandCase:
      RandCaseStatement::visitStmts<slang::ast::UnrollVisitor&>((RandCaseStatement *)this,visitor);
      return;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar4) {
        local_d0.field_2._M_allocated_capacity = *psVar4;
        local_d0.field_2._8_8_ = plVar3[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar4;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x10e);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_b0 == plVar5) {
        local_a0 = *plVar5;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar5;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_f0 == plVar5) {
        local_e0 = *plVar5;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar5;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  } while( true );
}

Assistant:

decltype(auto) Statement::visit(TVisitor&& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case StatementKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case StatementKind::Invalid: return visitor.visitInvalid(*this, std::forward<Args>(args)...);
        CASE(Empty, EmptyStatement);
        CASE(List, StatementList);
        CASE(Block, BlockStatement);
        CASE(ExpressionStatement, ExpressionStatement);
        CASE(VariableDeclaration, VariableDeclStatement);
        CASE(Return, ReturnStatement);
        CASE(Break, BreakStatement);
        CASE(Continue, ContinueStatement);
        CASE(Disable, DisableStatement);
        CASE(Conditional, ConditionalStatement);
        CASE(Case, CaseStatement);
        CASE(PatternCase, PatternCaseStatement);
        CASE(ForLoop, ForLoopStatement);
        CASE(RepeatLoop, RepeatLoopStatement);
        CASE(ForeachLoop, ForeachLoopStatement);
        CASE(WhileLoop, WhileLoopStatement);
        CASE(DoWhileLoop, DoWhileLoopStatement);
        CASE(ForeverLoop, ForeverLoopStatement);
        CASE(Timed, TimedStatement);
        CASE(ImmediateAssertion, ImmediateAssertionStatement);
        CASE(ConcurrentAssertion, ConcurrentAssertionStatement);
        CASE(DisableFork, DisableForkStatement);
        CASE(Wait, WaitStatement);
        CASE(WaitFork, WaitForkStatement);
        CASE(WaitOrder, WaitOrderStatement);
        CASE(EventTrigger, EventTriggerStatement);
        CASE(ProceduralAssign, ProceduralAssignStatement);
        CASE(ProceduralDeassign, ProceduralDeassignStatement);
        CASE(RandCase, RandCaseStatement);
        CASE(RandSequence, RandSequenceStatement);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}